

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::Resource::Resource
          (Resource *this,OperationContext *context,ResourceDescription *desc,deUint32 usage,
          VkSharingMode sharingMode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilyIndex)

{
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *this_00;
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *this_01;
  ResourceType type;
  uint uVar1;
  deUint32 dVar2;
  VkImageType imageType;
  VkFormat format;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  pointer puVar5;
  bool bVar6;
  int iVar7;
  Buffer *this_02;
  Image *this_03;
  NotSupportedError *this_04;
  ulong uVar8;
  deUint32 dVar9;
  VkDeviceSize bufferSize;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> local_b8
  ;
  VkBufferCreateInfo bufferCreateInfo;
  uint local_70;
  VkImageFormatProperties imageFormatProperties;
  
  type = desc->type;
  this->m_type = type;
  this_00 = &this->m_buffer;
  (this->m_buffer).
  super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>.
  m_data.ptr = (Buffer *)0x0;
  this_01 = &this->m_image;
  (this->m_image).
  super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
  m_data.ptr = (Image *)0x0;
  vk = context->m_vk;
  device = context->m_device;
  allocator = context->m_allocator;
  if (type != RESOURCE_TYPE_BUFFER) {
    pIVar3 = context->m_vki;
    pVVar4 = context->m_physicalDevice;
    bVar6 = isIndirectBuffer(type);
    if (!bVar6) {
      if (this->m_type != RESOURCE_TYPE_IMAGE) {
        return;
      }
      uVar1 = (desc->size).m_data[1];
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 2) {
        uVar8 = 1;
      }
      dVar2 = (desc->size).m_data[2];
      dVar9 = 1;
      if (1 < (int)dVar2) {
        dVar9 = dVar2;
      }
      uVar8 = uVar8 << 0x20 | (ulong)(uint)(desc->size).m_data[0];
      (this->m_imageData).extent.width = (int)uVar8;
      (this->m_imageData).extent.height = (int)(uVar8 >> 0x20);
      (this->m_imageData).extent.depth = dVar9;
      imageType = desc->imageType;
      (this->m_imageData).imageType = imageType;
      format = desc->imageFormat;
      (this->m_imageData).format = format;
      (this->m_imageData).subresourceRange.aspectMask = desc->imageAspect;
      (this->m_imageData).subresourceRange.baseMipLevel = 0;
      (this->m_imageData).subresourceRange.levelCount = 1;
      (this->m_imageData).subresourceRange.baseArrayLayer = 0;
      (this->m_imageData).subresourceRange.layerCount = 1;
      uVar1 = desc->imageAspect;
      (this->m_imageData).subresourceLayers.aspectMask = (int)(ulong)uVar1;
      (this->m_imageData).subresourceLayers.mipLevel = (int)((ulong)uVar1 >> 0x20);
      (this->m_imageData).subresourceLayers.baseArrayLayer = 0;
      (this->m_imageData).subresourceLayers.layerCount = 1;
      makeImageCreateInfo((VkImageCreateInfo *)&bufferCreateInfo,imageType,
                          &(this->m_imageData).extent,format,usage);
      iVar7 = (*pIVar3->_vptr_InstanceInterface[4])
                        (pIVar3,pVVar4,(ulong)(uint)bufferCreateInfo.size,
                         (ulong)(uint)bufferCreateInfo._20_4_,
                         (ulong)bufferCreateInfo.pQueueFamilyIndices >> 0x20,(ulong)local_70,
                         (ulong)bufferCreateInfo.flags,&imageFormatProperties);
      if (iVar7 == 0) {
        this_03 = (Image *)operator_new(0x30);
        Image::Image(this_03,vk,device,allocator,(VkImageCreateInfo *)&bufferCreateInfo,
                     (MemoryRequirement)0x0);
        local_b8.m_data.ptr = (Image *)0x0;
        if ((this_01->
            super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
            ).m_data.ptr != this_03) {
          de::details::
          UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
          ::reset(&this_01->
                   super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                 );
          (this_01->
          super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
          ).m_data.ptr = this_03;
        }
        de::details::
        UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
        reset(&local_b8);
        (this->m_imageData).handle.m_internal =
             (((this->m_image).
               super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal;
        return;
      }
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_04,"Image format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationOperation.cpp"
                 ,0xd77);
      __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (this->m_bufferData).offset = 0;
  bufferSize = (VkDeviceSize)(desc->size).m_data[0];
  (this->m_bufferData).size = bufferSize;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,usage);
  puVar5 = (queueFamilyIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(queueFamilyIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  if (uVar8 != 0) {
    bufferCreateInfo.queueFamilyIndexCount = (deUint32)(uVar8 >> 2);
    bufferCreateInfo.pQueueFamilyIndices = puVar5;
  }
  bufferCreateInfo.sharingMode = sharingMode;
  this_02 = (Buffer *)operator_new(0x30);
  synchronization::Buffer::Buffer
            (this_02,vk,device,allocator,&bufferCreateInfo,(MemoryRequirement)0x0);
  imageFormatProperties.maxExtent.width = 0;
  imageFormatProperties.maxExtent.height = 0;
  if ((this_00->
      super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
      ).m_data.ptr != this_02) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&this_00->
           super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
         );
    (this_00->
    super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
    ).m_data.ptr = this_02;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            ((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&imageFormatProperties);
  (this->m_bufferData).handle.m_internal =
       (((this->m_buffer).
         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
         .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  return;
}

Assistant:

Resource::Resource (OperationContext& context, const ResourceDescription& desc, const deUint32 usage, const vk::VkSharingMode sharingMode, const std::vector<deUint32>& queueFamilyIndex)
	: m_type	(desc.type)
{
	const DeviceInterface&		vk			= context.getDeviceInterface();
	const InstanceInterface&	vki			= context.getInstanceInterface();
	const VkDevice				device		= context.getDevice();
	const VkPhysicalDevice		physDevice	= context.getPhysicalDevice();
	Allocator&					allocator	= context.getAllocator();

	if (m_type == RESOURCE_TYPE_BUFFER || isIndirectBuffer(m_type))
	{
		m_bufferData.offset					= 0u;
		m_bufferData.size					= static_cast<VkDeviceSize>(desc.size.x());
		VkBufferCreateInfo bufferCreateInfo = makeBufferCreateInfo(m_bufferData.size, usage);
		bufferCreateInfo.sharingMode		= sharingMode;
		if (queueFamilyIndex.size() > 0)
		{
			bufferCreateInfo.queueFamilyIndexCount	= static_cast<deUint32>(queueFamilyIndex.size());
			bufferCreateInfo.pQueueFamilyIndices	= &queueFamilyIndex[0];
		}
		m_buffer			= de::MovePtr<Buffer>(new Buffer(vk, device, allocator, bufferCreateInfo, MemoryRequirement::Any));
		m_bufferData.handle	= **m_buffer;
	}
	else if (m_type == RESOURCE_TYPE_IMAGE)
	{
		m_imageData.extent				= makeExtent3D(desc.size.x(), std::max(1, desc.size.y()), std::max(1, desc.size.z()));
		m_imageData.imageType			= desc.imageType;
		m_imageData.format				= desc.imageFormat;
		m_imageData.subresourceRange	= makeImageSubresourceRange(desc.imageAspect, 0u, 1u, 0u, 1u);
		m_imageData.subresourceLayers	= makeImageSubresourceLayers(desc.imageAspect, 0u, 0u, 1u);
		VkImageCreateInfo imageInfo		= makeImageCreateInfo(m_imageData.imageType, m_imageData.extent, m_imageData.format, usage);
		imageInfo.sharingMode			= sharingMode;
		if (queueFamilyIndex.size() > 0)
		{
			imageInfo.queueFamilyIndexCount	= static_cast<deUint32>(queueFamilyIndex.size());
			imageInfo.pQueueFamilyIndices	= &queueFamilyIndex[0];
		}

		VkImageFormatProperties	imageFormatProperties;
		const VkResult formatResult		= vki.getPhysicalDeviceImageFormatProperties(physDevice, imageInfo.format, imageInfo.imageType, imageInfo.tiling, imageInfo.usage, imageInfo.flags, &imageFormatProperties);

		if (formatResult != VK_SUCCESS)
			TCU_THROW(NotSupportedError, "Image format is not supported");

		m_image							= de::MovePtr<Image>(new Image(vk, device, allocator, imageInfo, MemoryRequirement::Any));
		m_imageData.handle				= **m_image;
	}
	else
		DE_ASSERT(0);
}